

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::conditionalizeExpensiveOnBitwise
          (OptimizeInstructions *this,Binary *binary)

{
  Id IVar1;
  PassRunner *pPVar2;
  Binary *this_00;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Const *pCVar8;
  If *pIVar9;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_01;
  ulong in_R8;
  Binary *pBVar10;
  Binary *this_02;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 local_328 [8];
  EffectAnalyzer leftEffects;
  EffectAnalyzer rightEffects;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Builder local_38;
  Builder builder;
  
  pPVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  if ((pPVar2->options).optimizeLevel < 2) {
    return (Expression *)(If *)0x0;
  }
  if (0 < (pPVar2->options).shrinkLevel) {
    return (Expression *)(If *)0x0;
  }
  if (1 < binary->op - AndInt32) {
    __assert_fail("binary->op == AndInt32 || binary->op == OrInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xd6c,
                  "Expression *wasm::OptimizeInstructions::conditionalizeExpensiveOnBitwise(Binary *)"
                 );
  }
  this_02 = (Binary *)binary->right;
  if ((this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == ConstId)
  {
    return (Expression *)(If *)0x0;
  }
  this_00 = (Binary *)binary->left;
  IVar1 = (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id;
  if (IVar1 < RefEqId) {
    if (IVar1 == UnaryId) {
      bVar4 = Unary::isRelational((Unary *)this_00);
    }
    else {
      if (IVar1 != BinaryId) {
        if (IVar1 != RefIsNullId) {
          return (Expression *)(If *)0x0;
        }
        goto LAB_009dbafe;
      }
      bVar4 = Binary::isRelational(this_00);
    }
    if (bVar4 == false) {
      return (Expression *)(If *)0x0;
    }
  }
  else if ((IVar1 != RefEqId) && (IVar1 != RefTestId)) {
    if (IVar1 != StringEqId) {
      return (Expression *)(If *)0x0;
    }
    if (this_00->op != AddInt32) {
      return (Expression *)(If *)0x0;
    }
  }
LAB_009dbafe:
  IVar1 = (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id;
  if (IVar1 < RefEqId) {
    if (IVar1 == UnaryId) {
      bVar4 = Unary::isRelational((Unary *)this_02);
    }
    else {
      if (IVar1 != BinaryId) {
        if (IVar1 != RefIsNullId) {
          return (Expression *)(If *)0x0;
        }
        goto LAB_009dbb58;
      }
      bVar4 = Binary::isRelational(this_02);
    }
    if (bVar4 == false) {
      return (Expression *)(If *)0x0;
    }
  }
  else if ((IVar1 != RefEqId) && (IVar1 != RefTestId)) {
    if (IVar1 != StringEqId) {
      return (Expression *)(If *)0x0;
    }
    if (this_02->op != AddInt32) {
      return (Expression *)(If *)0x0;
    }
  }
LAB_009dbb58:
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_328,
             &((this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule,(Expression *)this_00);
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)
             &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &((this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule,(Expression *)this_02);
  pBVar10 = this_00;
  if (leftEffects.readsMemory == false) {
    bVar4 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)local_328);
    if (rightEffects.readsMemory == false) goto LAB_009dbbd4;
    if (bVar4) goto LAB_009dbccf;
LAB_009dbbed:
    uVar5 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                      ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_38,(Expression *)this_00)
    ;
    if ((6 < uVar5) &&
       (bVar4 = EffectAnalyzer::invalidates
                          ((EffectAnalyzer *)local_328,
                           (EffectAnalyzer *)
                           &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count), !bVar4)) goto LAB_009dbc79;
  }
  else {
    bVar4 = true;
    if (rightEffects.readsMemory == false) {
LAB_009dbbd4:
      bVar3 = EffectAnalyzer::hasNonTrapSideEffects
                        ((EffectAnalyzer *)
                         &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
      if ((bVar4 & bVar3) == 0) {
        if (bVar3) goto LAB_009dbbed;
        if (bVar4 == false) {
          uVar6 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                            ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_38,
                             (Expression *)this_00);
          uVar7 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                            ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_38,
                             (Expression *)this_02);
          uVar5 = uVar7;
          if (uVar7 < uVar6) {
            uVar5 = uVar6;
          }
          if (6 < uVar5) {
            if (uVar6 <= uVar7) {
              pBVar10 = this_02;
              this_02 = this_00;
            }
            goto LAB_009dbc79;
          }
        }
        else {
          uVar5 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                            ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_38,
                             (Expression *)this_02);
          pBVar10 = this_02;
          this_02 = this_00;
          if (6 < uVar5) {
LAB_009dbc79:
            local_38.wasm =
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule;
            if (binary->op == OrInt32) {
              rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
                   1;
              pCVar8 = Builder::makeConst(&local_38,
                                          (Literal *)
                                          &rightEffects.delegateTargets._M_t._M_impl.
                                           super__Rb_tree_header._M_node_count);
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   (_Storage<wasm::Type,_true>)in_R8;
              pIVar9 = Builder::makeIf(&local_38,(Expression *)this_02,(Expression *)pCVar8,
                                       (Expression *)pBVar10,type);
              this_01 = (anon_union_16_6_1532cd5a_for_Literal_0 *)
                        &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count;
            }
            else {
              local_50.i32 = 0;
              local_40 = 2;
              pCVar8 = Builder::makeConst(&local_38,(Literal *)&local_50.func);
              type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   (_Storage<wasm::Type,_true>)in_R8;
              pIVar9 = Builder::makeIf(&local_38,(Expression *)this_02,(Expression *)pBVar10,
                                       (Expression *)pCVar8,type_00);
              this_01 = &local_50;
            }
            Literal::~Literal((Literal *)&this_01->func);
            goto LAB_009dbcd2;
          }
        }
      }
    }
  }
LAB_009dbccf:
  pIVar9 = (If *)0x0;
LAB_009dbcd2:
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&rightEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&rightEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&rightEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&rightEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&rightEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&rightEffects.features);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&leftEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&leftEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&leftEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&leftEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&leftEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&leftEffects.features);
  return (Expression *)pIVar9;
}

Assistant:

Expression* conditionalizeExpensiveOnBitwise(Binary* binary) {
    // this operation can increase code size, so don't always do it
    auto& options = getPassRunner()->options;
    if (options.optimizeLevel < 2 || options.shrinkLevel > 0) {
      return nullptr;
    }
    const auto MIN_COST = 7;
    assert(binary->op == AndInt32 || binary->op == OrInt32);
    if (binary->right->is<Const>()) {
      return nullptr; // trivial
    }
    // bitwise logical operator on two non-numerical values, check if they are
    // boolean
    auto* left = binary->left;
    auto* right = binary->right;
    if (!Properties::emitsBoolean(left) || !Properties::emitsBoolean(right)) {
      return nullptr;
    }
    auto leftEffects = effects(left);
    auto rightEffects = effects(right);
    auto leftHasSideEffects = leftEffects.hasSideEffects();
    auto rightHasSideEffects = rightEffects.hasSideEffects();
    if (leftHasSideEffects && rightHasSideEffects) {
      return nullptr; // both must execute
    }
    // canonicalize with side effects, if any, happening on the left
    if (rightHasSideEffects) {
      if (CostAnalyzer(left).cost < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
      if (leftEffects.invalidates(rightEffects)) {
        return nullptr; // cannot reorder
      }
      std::swap(left, right);
    } else if (leftHasSideEffects) {
      if (CostAnalyzer(right).cost < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
    } else {
      // no side effects, reorder based on cost estimation
      auto leftCost = CostAnalyzer(left).cost;
      auto rightCost = CostAnalyzer(right).cost;
      if (std::max(leftCost, rightCost) < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
      // canonicalize with expensive code on the right
      if (leftCost > rightCost) {
        std::swap(left, right);
      }
    }
    // worth it! perform conditionalization
    Builder builder(*getModule());
    if (binary->op == OrInt32) {
      return builder.makeIf(
        left, builder.makeConst(Literal(int32_t(1))), right);
    } else { // &
      return builder.makeIf(
        left, right, builder.makeConst(Literal(int32_t(0))));
    }
  }